

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  Pgno pgno;
  Bitvec *p;
  bool bVar1;
  bool bVar2;
  MemPage *pMVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  u8 *puVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  undefined7 in_register_00000081;
  uint uVar15;
  bool bVar16;
  MemPage *pMVar17;
  MemPage *pTrunk;
  u8 eType;
  MemPage *local_a0;
  int local_94;
  MemPage *local_78;
  undefined4 local_6c;
  MemPage *local_68;
  uint local_5c;
  uint *local_58;
  MemPage *local_50;
  ulong local_48;
  Pgno local_3c;
  ulong local_38;
  
  local_78 = (MemPage *)0x0;
  pMVar17 = pBt->pPage1;
  uVar9 = pBt->nPage;
  uVar10 = *(uint *)(pMVar17->aData + 0x24);
  uVar13 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  local_38 = (ulong)uVar13;
  if (uVar9 <= uVar13) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfbb5,
                "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
    return 0xb;
  }
  if (uVar10 == 0) {
    bVar16 = pBt->bDoTruncate == '\0';
    iVar6 = (int)CONCAT71((int7)((ulong)pMVar17 >> 8),bVar16);
    iVar4 = sqlite3PagerWrite(pMVar17->pDbPage);
    if (iVar4 == 0) {
      uVar9 = pBt->nPage;
      pBt->nPage = uVar9 + 1;
      uVar10 = (uint)sqlite3PendingByte / pBt->pageSize;
      if (uVar9 == uVar10) {
        pBt->nPage = uVar9 + 2;
      }
      uVar9 = (uint)bVar16;
      if (pBt->autoVacuum != '\0') {
        uVar13 = pBt->nPage;
        uVar15 = 0;
        if (1 < uVar13) {
          iVar4 = (uVar13 - 2) - (uVar13 - 2) % (pBt->usableSize / 5 + 1);
          uVar15 = iVar4 + (uint)(iVar4 + 1U == uVar10) + 2;
        }
        if (uVar15 == uVar13) {
          local_50 = (MemPage *)0x0;
          iVar4 = btreeGetUnusedPage(pBt,uVar13,&local_50,uVar9);
          pMVar17 = local_50;
          if ((iVar4 == 0) &&
             (iVar4 = sqlite3PagerWrite(local_50->pDbPage), pMVar17 != (MemPage *)0x0)) {
            sqlite3PagerUnrefNotNull(pMVar17->pDbPage);
          }
          if (iVar4 != 0) goto LAB_00129e9b;
          uVar10 = pBt->nPage;
          pBt->nPage = uVar10 + 1;
          iVar6 = iVar4;
          if (uVar10 == (uint)sqlite3PendingByte / pBt->pageSize) {
            pBt->nPage = uVar10 + 2;
          }
        }
      }
      uVar10 = pBt->nPage;
      *(uint *)(pBt->pPage1->aData + 0x1c) =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      pgno = pBt->nPage;
      *pPgno = pgno;
      iVar4 = btreeGetUnusedPage(pBt,pgno,ppPage,uVar9);
      if (iVar4 != 0) goto LAB_00129e9b;
      iVar4 = sqlite3PagerWrite((*ppPage)->pDbPage);
      bVar16 = true;
      if (iVar4 != 0) {
        if (*ppPage != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
        }
        *ppPage = (MemPage *)0x0;
      }
    }
    else {
LAB_00129e9b:
      bVar16 = false;
      iVar6 = iVar4;
    }
    if (!bVar16) {
      return iVar6;
    }
    local_a0 = (MemPage *)0x0;
    goto LAB_00129f41;
  }
  local_3c = nearby;
  if (eMode == '\x02') {
    bVar16 = true;
LAB_00129830:
    iVar4 = sqlite3PagerWrite(pMVar17->pDbPage);
    if (iVar4 == 0) {
      uVar10 = (int)local_38 - 1;
      *(uint *)(pMVar17->aData + 0x24) =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 * 0x1000000;
      local_48 = 0;
      local_6c = (int)CONCAT71(in_register_00000081,eMode);
      local_68 = pMVar17;
      local_58 = pPgno;
      do {
        local_a0 = local_78;
        if (local_78 == (MemPage *)0x0) {
          puVar7 = (uint *)(local_68->aData + 0x20);
        }
        else {
          puVar7 = (uint *)local_78->aData;
        }
        uVar10 = *puVar7;
        uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
        ;
        if (uVar9 < uVar10) {
LAB_001298c1:
          iVar4 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfbed,
                      "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
        }
        else {
          uVar13 = (uint)local_48 + 1;
          if ((uint)local_38 < (uint)local_48) {
            local_48 = (ulong)uVar13;
            goto LAB_001298c1;
          }
          iVar4 = btreeGetUnusedPage(pBt,uVar10,&local_78,0);
          local_48 = (ulong)uVar13;
        }
        pMVar17 = local_78;
        if (iVar4 != 0) {
          local_78 = (MemPage *)0x0;
          goto LAB_00129f36;
        }
        puVar8 = local_78->aData;
        uVar13 = *(uint *)(puVar8 + 4);
        if ((bVar16) || (uVar13 != 0)) {
          uVar15 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                   uVar13 << 0x18;
          if ((pBt->usableSize >> 2) - 2 < uVar15) {
            iVar4 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfc0a,
                        "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
            goto LAB_00129f36;
          }
          if (bVar16) {
            if ((uVar10 != local_3c) && ((char)local_6c != '\x02' || local_3c <= uVar10))
            goto LAB_001299af;
            *local_58 = uVar10;
            *ppPage = local_78;
            iVar4 = sqlite3PagerWrite(local_78->pDbPage);
            if (iVar4 != 0) goto LAB_00129f36;
            if (uVar13 == 0) {
              if (local_a0 == (MemPage *)0x0) {
                puVar8 = local_68->aData + 0x20;
              }
              else {
                iVar4 = sqlite3PagerWrite(local_a0->pDbPage);
                if (iVar4 != 0) goto LAB_00129f36;
                puVar8 = local_a0->aData;
              }
              *(undefined4 *)puVar8 = *(undefined4 *)pMVar17->aData;
              iVar4 = 0;
            }
            else {
              uVar10 = *(uint *)(pMVar17->aData + 8);
              uVar13 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                       uVar10 << 0x18;
              if (uVar9 < uVar13) {
                iVar4 = 0xb;
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfc2c,
                            "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
LAB_00129b5b:
                bVar16 = false;
              }
              else {
                local_5c = uVar10;
                iVar4 = btreeGetUnusedPage(pBt,uVar13,&local_50,0);
                pMVar3 = local_50;
                if (iVar4 != 0) goto LAB_00129b5b;
                iVar4 = sqlite3PagerWrite(local_50->pDbPage);
                if (iVar4 == 0) {
                  *(undefined4 *)pMVar3->aData = *(undefined4 *)pMVar17->aData;
                  uVar10 = uVar15 - 1;
                  *(uint *)(pMVar3->aData + 4) =
                       uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                       uVar10 * 0x1000000;
                  memcpy(pMVar3->aData + 8,pMVar17->aData + 0xc,(ulong)(uVar15 * 4 - 4));
                  if (pMVar3 != (MemPage *)0x0) {
                    sqlite3PagerUnrefNotNull(pMVar3->pDbPage);
                  }
                  if (local_a0 == (MemPage *)0x0) {
                    *(uint *)(local_68->aData + 0x20) = local_5c;
                    bVar16 = true;
                    iVar4 = 0;
                  }
                  else {
                    iVar6 = sqlite3PagerWrite(local_a0->pDbPage);
                    iVar4 = 0;
                    if (iVar6 == 0) {
                      *(uint *)local_a0->aData = local_5c;
                      bVar16 = true;
                    }
                    else {
                      bVar16 = false;
                      iVar4 = iVar6;
                    }
                  }
                }
                else {
                  if (pMVar3 != (MemPage *)0x0) {
                    sqlite3PagerUnrefNotNull(pMVar3->pDbPage);
                  }
                  bVar16 = false;
                }
              }
              if (!bVar16) goto LAB_00129f36;
            }
            local_78 = (MemPage *)0x0;
            bVar1 = false;
          }
          else {
LAB_001299af:
            if (uVar13 == 0) goto LAB_00129a97;
            uVar10 = 0;
            if (local_3c != 0) {
              if ((char)local_6c == '\x02') {
                uVar11 = 8;
                uVar12 = 0;
                do {
                  uVar13 = *(uint *)(puVar8 + (uVar11 & 0xffffffff));
                  if ((uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                      uVar13 << 0x18) <= local_3c) {
                    uVar10 = (uint)uVar12;
                    break;
                  }
                  uVar12 = uVar12 + 1;
                  uVar11 = uVar11 + 4;
                } while (uVar15 + (uVar15 == 0) != uVar12);
              }
              else {
                uVar10 = 0;
                if (1 < uVar15) {
                  uVar10 = *(uint *)(puVar8 + 8);
                  iVar4 = (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                          uVar10 << 0x18) - local_3c;
                  iVar6 = -iVar4;
                  if (-1 < iVar4) {
                    iVar6 = iVar4;
                  }
                  uVar10 = 0;
                  uVar11 = 1;
                  uVar13 = 0xc;
                  do {
                    uVar5 = *(uint *)(puVar8 + uVar13);
                    iVar14 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                             uVar5 << 0x18) - local_3c;
                    iVar4 = -iVar14;
                    if (-1 < iVar14) {
                      iVar4 = iVar14;
                    }
                    if (iVar4 < iVar6) {
                      uVar10 = (uint)uVar11;
                      iVar6 = iVar4;
                    }
                    uVar11 = uVar11 + 1;
                    uVar13 = uVar13 + 4;
                  } while (uVar15 != uVar11);
                }
              }
            }
            uVar13 = uVar10 * 4 + 8;
            uVar5 = *(uint *)(puVar8 + uVar13);
            uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
            if (uVar9 < uVar5) {
              iVar4 = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfc6d,
                          "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
LAB_00129c07:
              bVar2 = false;
            }
            else if (((uVar5 == local_3c) || ((char)local_6c == '\x02' && uVar5 < local_3c)) ||
                    (!bVar16)) {
              *local_58 = uVar5;
              iVar4 = sqlite3PagerWrite(local_78->pDbPage);
              if (iVar4 != 0) goto LAB_00129c07;
              uVar5 = uVar15 - 1;
              if (uVar10 < uVar5) {
                *(undefined4 *)(puVar8 + uVar13) = *(undefined4 *)(puVar8 + (uVar15 * 4 + 4));
              }
              *(uint *)(puVar8 + 4) =
                   uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                   uVar5 * 0x1000000;
              uVar10 = *local_58;
              p = pBt->pHasContent;
              if (p == (Bitvec *)0x0) {
                uVar13 = 1;
              }
              else {
                uVar13 = 0;
                if (uVar10 <= p->iSize) {
                  iVar6 = sqlite3BitvecTestNotNull(p,uVar10);
                  uVar13 = (uint)(iVar6 == 0);
                }
              }
              iVar4 = btreeGetUnusedPage(pBt,uVar10,ppPage,uVar13);
              if (iVar4 != 0) {
                bVar16 = false;
                goto LAB_00129be5;
              }
              iVar4 = sqlite3PagerWrite((*ppPage)->pDbPage);
              bVar2 = true;
              if (iVar4 == 0) {
                bVar16 = false;
                iVar4 = 0;
              }
              else {
                if (*ppPage != (MemPage *)0x0) {
                  sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
                }
                *ppPage = (MemPage *)0x0;
                bVar16 = false;
              }
            }
            else {
              bVar16 = true;
              iVar4 = 0;
LAB_00129be5:
              bVar2 = true;
            }
            bVar1 = bVar16;
            if (!bVar2) goto LAB_00129f36;
          }
        }
        else {
          iVar4 = sqlite3PagerWrite(local_78->pDbPage);
          if (iVar4 != 0) goto LAB_00129f36;
          *local_58 = uVar10;
          *(undefined4 *)(local_68->aData + 0x20) = *(undefined4 *)pMVar17->aData;
          *ppPage = pMVar17;
          local_78 = (MemPage *)0x0;
          bVar16 = false;
LAB_00129a97:
          iVar4 = 0;
          bVar1 = bVar16;
        }
        if (local_a0 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_a0->pDbPage);
        }
        bVar16 = true;
      } while (bVar1);
      local_a0 = (MemPage *)0x0;
LAB_00129f36:
      bVar16 = false;
    }
    else {
      bVar16 = true;
      local_a0 = (MemPage *)0x0;
      local_94 = iVar4;
    }
  }
  else {
    if ((eMode != '\x01') || (uVar9 < nearby)) {
      bVar16 = false;
      goto LAB_00129830;
    }
    local_a0 = (MemPage *)0x0;
    local_68 = pMVar17;
    iVar4 = ptrmapGet(pBt,nearby,(u8 *)&local_50,(Pgno *)0x0);
    bVar16 = true;
    local_94 = iVar4;
    if (iVar4 == 0) {
      bVar16 = iVar4 == 0 && (char)local_50 == '\x02';
      pMVar17 = local_68;
      goto LAB_00129830;
    }
  }
  if (bVar16) {
    return local_94;
  }
LAB_00129f41:
  if (local_78 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(local_78->pDbPage);
  }
  if (local_a0 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(local_a0->pDbPage);
  }
  return iVar4;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-05119-02637 The 4-byte big-endian integer at offset 36
  ** stores stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    u32 nSearch = 0;   /* Count of the number of search attempts */
    
    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage || nSearch++ > n ){
        rc = SQLITE_CORRUPT_BKPT;
      }else{
        rc = btreeGetUnusedPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched. 
        ** So extract the trunk page itself and use it as the newly 
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_BKPT;
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList 
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE)) 
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains 
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){ 
            rc = SQLITE_CORRUPT_BKPT;
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetUnusedPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage ){
          rc = SQLITE_CORRUPT_BKPT;
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList 
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE)) 
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %d was leaf %d of %d on trunk %d"
                 ": %d more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
              *ppPage = 0;
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal 
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %d from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetUnusedPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
      *ppPage = 0;
    }
    TRACE(("ALLOCATE: %d from end of file\n", *pPgno));
  }

  assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  assert( rc!=SQLITE_OK || sqlite3PagerPageRefcount((*ppPage)->pDbPage)<=1 );
  assert( rc!=SQLITE_OK || (*ppPage)->isInit==0 );
  return rc;
}